

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManSerializer.cpp
# Opt level: O1

void __thiscall adios2::format::DataManSerializer::PutAttributes(DataManSerializer *this,IO *io)

{
  value_t vVar1;
  json_value jVar2;
  int iVar3;
  AttrMap *pAVar4;
  Attribute<signed_char> *attribute;
  Attribute<char> *attribute_00;
  Attribute<std::complex<float>_> *attribute_01;
  Attribute<unsigned_char> *attribute_02;
  Attribute<std::complex<double>_> *attribute_03;
  Attribute<double> *attribute_04;
  Attribute<int> *attribute_05;
  Attribute<long> *attribute_06;
  Attribute<unsigned_long> *attribute_07;
  Attribute<short> *attribute_08;
  Attribute<unsigned_short> *attribute_09;
  Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *attribute_10;
  Attribute<unsigned_int> *attribute_11;
  Attribute<long_double> *attribute_12;
  Attribute<float> *attribute_13;
  reference pvVar5;
  undefined8 uVar6;
  _Hash_node_base *p_Var7;
  string name;
  ScopedTimer __var277;
  string local_2a8;
  IO *local_288;
  string local_280;
  _Hash_node_base *local_260;
  ScopedTimer local_258;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_250;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_240;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_230;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_220;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_288 = io;
  if ((PutAttributes(adios2::core::IO&)::__var77 == '\0') &&
     (iVar3 = __cxa_guard_acquire(&PutAttributes(adios2::core::IO&)::__var77), iVar3 != 0)) {
    uVar6 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/dataman/DataManSerializer.cpp"
                                ,"void adios2::format::DataManSerializer::PutAttributes(core::IO &)"
                                ,0x4d);
    PutAttributes::__var77 = (void *)ps_timer_create_(uVar6);
    __cxa_guard_release(&PutAttributes(adios2::core::IO&)::__var77);
  }
  local_258.m_timer = PutAttributes::__var77;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  pAVar4 = core::IO::GetAttributes_abi_cxx11_(local_288);
  p_Var7 = (pAVar4->_M_h)._M_before_begin._M_nxt;
  local_260 = p_Var7;
  if (p_Var7 != (_Hash_node_base *)0x0) {
    do {
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_280,p_Var7[1]._M_nxt,
                 (long)&(p_Var7[1]._M_nxt)->_M_nxt + (long)&(p_Var7[2]._M_nxt)->_M_nxt);
      switch(*(undefined4 *)&p_Var7[5]._M_nxt[5]._M_nxt) {
      case 1:
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"/","");
        attribute = core::IO::InquireAttribute<signed_char>
                              (local_288,&local_280,&local_2a8,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        PutAttribute<signed_char>(this,attribute);
        break;
      case 2:
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"/","");
        attribute_08 = core::IO::InquireAttribute<short>(local_288,&local_280,&local_2a8,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        PutAttribute<short>(this,attribute_08);
        break;
      case 3:
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"/","");
        attribute_05 = core::IO::InquireAttribute<int>(local_288,&local_280,&local_2a8,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        PutAttribute<int>(this,attribute_05);
        break;
      case 4:
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"/","");
        attribute_06 = core::IO::InquireAttribute<long>(local_288,&local_280,&local_2a8,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        PutAttribute<long>(this,attribute_06);
        break;
      case 5:
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"/","");
        attribute_02 = core::IO::InquireAttribute<unsigned_char>
                                 (local_288,&local_280,&local_2a8,&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        PutAttribute<unsigned_char>(this,attribute_02);
        break;
      case 6:
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"/","");
        attribute_09 = core::IO::InquireAttribute<unsigned_short>
                                 (local_288,&local_280,&local_2a8,&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        PutAttribute<unsigned_short>(this,attribute_09);
        break;
      case 7:
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"/","");
        attribute_11 = core::IO::InquireAttribute<unsigned_int>
                                 (local_288,&local_280,&local_2a8,&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        PutAttribute<unsigned_int>(this,attribute_11);
        break;
      case 8:
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"/","");
        attribute_07 = core::IO::InquireAttribute<unsigned_long>
                                 (local_288,&local_280,&local_2a8,&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        PutAttribute<unsigned_long>(this,attribute_07);
        break;
      case 9:
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"/","");
        attribute_13 = core::IO::InquireAttribute<float>(local_288,&local_280,&local_2a8,&local_190)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        PutAttribute<float>(this,attribute_13);
        break;
      case 10:
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"/","");
        attribute_04 = core::IO::InquireAttribute<double>
                                 (local_288,&local_280,&local_2a8,&local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        PutAttribute<double>(this,attribute_04);
        break;
      case 0xb:
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"/","");
        attribute_12 = core::IO::InquireAttribute<long_double>
                                 (local_288,&local_280,&local_2a8,&local_1d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        PutAttribute<long_double>(this,attribute_12);
        break;
      case 0xc:
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"/","");
        attribute_01 = core::IO::InquireAttribute<std::complex<float>>
                                 (local_288,&local_280,&local_2a8,&local_1f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        PutAttribute<std::complex<float>>(this,attribute_01);
        break;
      case 0xd:
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"/","");
        attribute_03 = core::IO::InquireAttribute<std::complex<double>>
                                 (local_288,&local_280,&local_2a8,&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        PutAttribute<std::complex<double>>(this,attribute_03);
        break;
      case 0xe:
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"/","");
        attribute_10 = core::IO::InquireAttribute<std::__cxx11::string>
                                 (local_288,&local_280,&local_2a8,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        PutAttribute<std::__cxx11::string>(this,attribute_10);
        break;
      case 0xf:
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"");
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"/","");
        attribute_00 = core::IO::InquireAttribute<char>(local_288,&local_280,&local_2a8,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p);
        }
        PutAttribute<char>(this,attribute_00);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p);
      }
      p_Var7 = p_Var7->_M_nxt;
    } while (p_Var7 != (_Hash_node_base *)0x0);
  }
  if (this->m_StaticDataFinished == false) {
    if (local_260 == (_Hash_node_base *)0x0) {
      local_280._M_dataplus._M_p = local_280._M_dataplus._M_p & 0xffffffffffffff00;
      local_280._M_string_length = 0;
      local_240.m_value.object = (object_t *)0x0;
      local_240.m_type = string;
      local_240.m_value.object =
           (object_t *)
           nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::create<std::__cxx11::string,char_const(&)[13]>((char (*) [13])"NoAttributes");
      pvVar5 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)&local_280,"N");
      vVar1 = pvVar5->m_type;
      pvVar5->m_type = local_240.m_type;
      jVar2 = pvVar5->m_value;
      (pvVar5->m_value).object = (object_t *)local_240.m_value;
      local_240.m_type = vVar1;
      local_240.m_value = jVar2;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_240);
      local_250.m_value.object = (object_t *)0x0;
      local_250.m_type = string;
      local_250.m_value.object =
           (object_t *)
           nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::create<std::__cxx11::string,char_const(&)[5]>((char (*) [5])"bool");
      pvVar5 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)&local_280,"Y");
      vVar1 = pvVar5->m_type;
      pvVar5->m_type = local_250.m_type;
      jVar2 = pvVar5->m_value;
      (pvVar5->m_value).object = (object_t *)local_250.m_value;
      local_250.m_type = vVar1;
      local_250.m_value = jVar2;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_250);
      local_220.m_type = null;
      local_220.m_value.object = (object_t *)0x0;
      nlohmann::detail::external_constructor<(nlohmann::detail::value_t)4>::
      construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (&local_220,true);
      pvVar5 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)&local_280,"V");
      vVar1 = pvVar5->m_type;
      pvVar5->m_type = local_220.m_type;
      jVar2 = pvVar5->m_value;
      (pvVar5->m_value).object = (object_t *)local_220.m_value;
      local_220.m_type = vVar1;
      local_220.m_value = jVar2;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_220);
      local_230.m_type = null;
      local_230.m_value.object = (object_t *)0x0;
      nlohmann::detail::external_constructor<(nlohmann::detail::value_t)4>::
      construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (&local_230,true);
      pvVar5 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)&local_280,"G");
      vVar1 = pvVar5->m_type;
      pvVar5->m_type = local_230.m_type;
      jVar2 = pvVar5->m_value;
      (pvVar5->m_value).object = (object_t *)local_230.m_value;
      local_230.m_type = vVar1;
      local_230.m_value = jVar2;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_230);
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_StaticDataJsonMutex);
      if (iVar3 != 0) {
        std::__throw_system_error(iVar3);
      }
      pvVar5 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)&this->m_StaticDataJson,"S");
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::
      emplace_back<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)pvVar5,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&local_280);
      pthread_mutex_unlock((pthread_mutex_t *)&this->m_StaticDataJsonMutex);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&local_280);
    }
    this->m_StaticDataFinished = true;
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_258);
  return;
}

Assistant:

void DataManSerializer::PutAttributes(core::IO &io)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();
    const auto &attributes = io.GetAttributes();
    bool attributePut = false;
    for (const auto &attributePair : attributes)
    {
        const std::string name(attributePair.first);
        const DataType type(attributePair.second->m_Type);
        if (type == DataType::None)
        {
        }
#define declare_type(T)                                                                            \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        core::Attribute<T> &attribute = *io.InquireAttribute<T>(name);                             \
        PutAttribute(attribute);                                                                   \
    }
        ADIOS2_FOREACH_ATTRIBUTE_STDTYPE_1ARG(declare_type)
#undef declare_type
        attributePut = true;
    }

    if (!m_StaticDataFinished)
    {
        if (!attributePut)
        {
            nlohmann::json staticVar;
            staticVar["N"] = "NoAttributes";
            staticVar["Y"] = "bool";
            staticVar["V"] = true;
            staticVar["G"] = true;
            m_StaticDataJsonMutex.lock();
            m_StaticDataJson["S"].emplace_back(std::move(staticVar));
            m_StaticDataJsonMutex.unlock();
        }
        m_StaticDataFinished = true;
    }
}